

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O0

int FFont::SimpleTranslation(BYTE *colorsused,BYTE *translation,BYTE *reverse,double **luminosity)

{
  undefined1 auVar1 [16];
  uint32 uVar2;
  uint32 uVar3;
  uint32 uVar4;
  ulong uVar5;
  double *pdVar6;
  int local_48;
  int local_44;
  int j;
  int i;
  double diver;
  double max;
  double min;
  double **luminosity_local;
  BYTE *reverse_local;
  BYTE *translation_local;
  BYTE *colorsused_local;
  
  memset(translation,0,0x100);
  *reverse = '\0';
  local_48 = 1;
  for (local_44 = 1; local_44 < 0x100; local_44 = local_44 + 1) {
    if (colorsused[local_44] != '\0') {
      reverse[local_48] = (BYTE)local_44;
      local_48 = local_48 + 1;
    }
  }
  qsort(reverse + 1,(long)(local_48 + -1),1,compare);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)local_48;
  uVar5 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  pdVar6 = (double *)operator_new__(uVar5);
  *luminosity = pdVar6;
  **luminosity = 0.0;
  diver = 0.0;
  max = 100000000.0;
  for (local_44 = 1; local_44 < local_48; local_44 = local_44 + 1) {
    translation[reverse[local_44]] = (BYTE)local_44;
    uVar2 = PalEntry::operator_cast_to_unsigned_int(GPalette.BaseColors + reverse[local_44]);
    uVar3 = PalEntry::operator_cast_to_unsigned_int(GPalette.BaseColors + reverse[local_44]);
    uVar4 = PalEntry::operator_cast_to_unsigned_int(GPalette.BaseColors + reverse[local_44]);
    (*luminosity)[local_44] =
         (double)(uVar2 >> 0x10 & 0xff) * 0.299 + (double)(uVar3 >> 8 & 0xff) * 0.587 +
         (double)(uVar4 & 0xff) * 0.114;
    if (diver < (*luminosity)[local_44]) {
      diver = (*luminosity)[local_44];
    }
    if ((*luminosity)[local_44] < max) {
      max = (*luminosity)[local_44];
    }
  }
  for (local_44 = 1; local_44 < local_48; local_44 = local_44 + 1) {
    (*luminosity)[local_44] = ((*luminosity)[local_44] - max) * (1.0 / (diver - max));
  }
  return local_48;
}

Assistant:

int FFont::SimpleTranslation (BYTE *colorsused, BYTE *translation, BYTE *reverse, double **luminosity)
{
	double min, max, diver;
	int i, j;

	memset (translation, 0, 256);

	reverse[0] = 0;
	for (i = 1, j = 1; i < 256; i++)
	{
		if (colorsused[i])
		{
			reverse[j++] = i;
		}
	}

	qsort (reverse+1, j-1, 1, compare);

	*luminosity = new double[j];
	(*luminosity)[0] = 0.0; // [BL] Prevent uninitalized memory
	max = 0.0;
	min = 100000000.0;
	for (i = 1; i < j; i++)
	{
		translation[reverse[i]] = i;

		(*luminosity)[i] = RPART(GPalette.BaseColors[reverse[i]]) * 0.299 +
						   GPART(GPalette.BaseColors[reverse[i]]) * 0.587 +
						   BPART(GPalette.BaseColors[reverse[i]]) * 0.114;
		if ((*luminosity)[i] > max)
			max = (*luminosity)[i];
		if ((*luminosity)[i] < min)
			min = (*luminosity)[i];
	}
	diver = 1.0 / (max - min);
	for (i = 1; i < j; i++)
	{
		(*luminosity)[i] = ((*luminosity)[i] - min) * diver;
	}

	return j;
}